

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O2

uint64_t __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::find_ass_cbit_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t slot_id,uint64_t *empty_id)

{
  bool bVar1;
  uint64_t num_vbits;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  do {
    bVar1 = get_vbit_(this,slot_id);
    slot_id = slot_id - 1 & (this->capa_size_).mask_;
    uVar2 = uVar2 + bVar1;
    bVar1 = is_vacant_(this,slot_id);
  } while (!bVar1);
  *empty_id = slot_id;
  if (uVar2 == 0) {
    slot_id = 0xffffffffffffffff;
  }
  else {
    for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + bVar1) {
      slot_id = slot_id + 1 & (this->capa_size_).mask_;
      bVar1 = get_cbit_(this,slot_id);
    }
  }
  return slot_id;
}

Assistant:

uint64_t find_ass_cbit_(uint64_t slot_id, uint64_t& empty_id) const {
        uint64_t num_vbits = 0;
        do {
            if (get_vbit_(slot_id)) {
                ++num_vbits;
            }
            slot_id = left_(slot_id);
        } while (!is_vacant_(slot_id));

        empty_id = slot_id;

        if (num_vbits == 0) {
            return UINT64_MAX;
        }

        uint64_t num_cbits = 0;
        while (num_cbits < num_vbits) {
            slot_id = right_(slot_id);
            if (get_cbit_(slot_id)) {
                ++num_cbits;
            }
        }

        return slot_id;
    }